

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_send_chunk(mg_connection *conn,char *chunk,uint chunk_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t len;
  int t;
  int ret;
  size_t lenbuf_len;
  char lenbuf [16];
  uint chunk_len_local;
  char *chunk_local;
  mg_connection *conn_local;
  
  lenbuf._12_4_ = chunk_len;
  sprintf((char *)&lenbuf_len,"%x\r\n",(ulong)chunk_len);
  len = strlen((char *)&lenbuf_len);
  iVar1 = mg_write(conn,&lenbuf_len,len);
  if (iVar1 == (int)len) {
    iVar2 = mg_write(conn,chunk,(ulong)(uint)lenbuf._12_4_);
    if (iVar2 == lenbuf._12_4_) {
      iVar3 = mg_write(conn,"\r\n",2);
      if (iVar3 == 2) {
        conn_local._4_4_ = iVar2 + iVar1 + 2;
      }
      else {
        conn_local._4_4_ = -1;
      }
    }
    else {
      conn_local._4_4_ = -1;
    }
  }
  else {
    conn_local._4_4_ = -1;
  }
  return conn_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_send_chunk(struct mg_connection *conn,
              const char *chunk,
              unsigned int chunk_len)
{
	char lenbuf[16];
	size_t lenbuf_len;
	int ret;
	int t;

	/* First store the length information in a text buffer. */
	sprintf(lenbuf, "%x\r\n", chunk_len);
	lenbuf_len = strlen(lenbuf);

	/* Then send length information, chunk and terminating \r\n. */
	ret = mg_write(conn, lenbuf, lenbuf_len);
	if (ret != (int)lenbuf_len) {
		return -1;
	}
	t = ret;

	ret = mg_write(conn, chunk, chunk_len);
	if (ret != (int)chunk_len) {
		return -1;
	}
	t += ret;

	ret = mg_write(conn, "\r\n", 2);
	if (ret != 2) {
		return -1;
	}
	t += ret;

	return t;
}